

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O3

uint32_t trico_get_number_of_uvs(void *a)

{
  if (((*(int *)((long)a + 0x24) - 5U < 4) && (*(int *)((long)a + 0x40) == 0)) &&
     ((ulong)((long)*(uint32_t **)((long)a + 0x18) + (4 - *(long *)((long)a + 0x10))) <=
      *(ulong *)((long)a + 0x30))) {
    return **(uint32_t **)((long)a + 0x18);
  }
  return 0;
}

Assistant:

uint32_t trico_get_number_of_uvs(void* a)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (arch->next_stream_type == trico_uv_per_vertex_float_stream || arch->next_stream_type == trico_uv_per_vertex_double_stream ||
    arch->next_stream_type == trico_uv_per_triangle_float_stream || arch->next_stream_type == trico_uv_per_triangle_double_stream)
    {
    uint32_t nr_uvs;
    if (!read_inplace(&nr_uvs, sizeof(uint32_t), 1, arch))
      return 0;
    return nr_uvs;
    }
  return 0;
  }